

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event_queue.cpp
# Opt level: O3

void __thiscall
sc_core::sc_event_queue::sc_event_queue(sc_event_queue *this,void **vtt,sc_module_name *name_)

{
  int *piVar1;
  sc_sensitive *this_00;
  sc_event_queue_if sVar2;
  sc_simcontext *this_01;
  sc_process_handle fire_event_handle;
  sc_process_handle local_48;
  sc_process_handle local_40;
  sc_process_handle local_38;
  
  sVar2 = *(sc_event_queue_if *)(vtt + 1);
  this->super_sc_event_queue_if = sVar2;
  *(void **)(&(this->super_sc_event_queue_if).field_0x0 + *(long *)((long)sVar2 + -0x30)) = vtt[2];
  sc_module::sc_module(&this->super_sc_module,name_);
  sVar2 = (sc_event_queue_if)*vtt;
  this->super_sc_event_queue_if = sVar2;
  *(void **)(&(this->super_sc_event_queue_if).field_0x0 + *(long *)((long)sVar2 + -0x30)) = vtt[3];
  (this->super_sc_module).super_sc_object._vptr_sc_object = (_func_int **)&PTR_print_00265f18;
  (this->super_sc_module).super_sc_process_host._vptr_sc_process_host =
       (_func_int **)&PTR__sc_event_queue_00265fc0;
  sc_ppq<sc_core::sc_time_*>::sc_ppq(&this->m_ppq,0x80,sc_time_compare);
  sc_event::sc_event(&this->m_e,0);
  this->m_change_stamp = 0;
  this->m_pending_delta = 0;
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    this_01 = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(this_01);
    sc_curr_simcontext = this_01;
    sc_default_global_context = this_01;
  }
  sc_simcontext::create_method_process
            ((sc_simcontext *)&fire_event_handle,(char *)sc_curr_simcontext,true,0,
             (sc_process_host *)fire_event,(sc_spawn_options *)0xffffffffffffff88);
  local_38.m_target_p = fire_event_handle.m_target_p;
  if (fire_event_handle.m_target_p != (sc_process_b *)0x0) {
    if ((fire_event_handle.m_target_p)->m_references_n == 0) goto LAB_0019e40c;
    (fire_event_handle.m_target_p)->m_references_n =
         (fire_event_handle.m_target_p)->m_references_n + 1;
  }
  this_00 = &(this->super_sc_module).sensitive;
  sc_sensitive::operator<<(this_00,&local_38);
  if (local_38.m_target_p != (sc_process_b *)0x0) {
    piVar1 = &(local_38.m_target_p)->m_references_n;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sc_process_b::delete_process(local_38.m_target_p);
    }
  }
  local_40.m_target_p = fire_event_handle.m_target_p;
  if (fire_event_handle.m_target_p != (sc_process_b *)0x0) {
    if ((fire_event_handle.m_target_p)->m_references_n == 0) goto LAB_0019e40c;
    (fire_event_handle.m_target_p)->m_references_n =
         (fire_event_handle.m_target_p)->m_references_n + 1;
  }
  sc_sensitive_pos::operator<<(&(this->super_sc_module).sensitive_pos,&local_40);
  if (local_40.m_target_p != (sc_process_b *)0x0) {
    piVar1 = &(local_40.m_target_p)->m_references_n;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sc_process_b::delete_process(local_40.m_target_p);
    }
  }
  local_48.m_target_p = fire_event_handle.m_target_p;
  if (fire_event_handle.m_target_p != (sc_process_b *)0x0) {
    if ((fire_event_handle.m_target_p)->m_references_n == 0) {
LAB_0019e40c:
      sc_assertion_failed("m_references_n != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_process.h"
                          ,0x277);
    }
    (fire_event_handle.m_target_p)->m_references_n =
         (fire_event_handle.m_target_p)->m_references_n + 1;
  }
  sc_sensitive_neg::operator<<(&(this->super_sc_module).sensitive_neg,&local_48);
  if (local_48.m_target_p != (sc_process_b *)0x0) {
    piVar1 = &(local_48.m_target_p)->m_references_n;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sc_process_b::delete_process(local_48.m_target_p);
    }
  }
  if (fire_event_handle.m_target_p != (sc_process_b *)0x0) {
    piVar1 = &(fire_event_handle.m_target_p)->m_references_n;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      sc_process_b::delete_process(fire_event_handle.m_target_p);
    }
  }
  sc_sensitive::operator<<(this_00,&this->m_e);
  sc_module::dont_initialize(&this->super_sc_module);
  return;
}

Assistant:

sc_event_queue::sc_event_queue( sc_module_name name_ )
    : sc_module( name_ ),
      m_ppq( 128, sc_time_compare ),
      m_e( sc_event::kernel_event ),
      m_change_stamp(0),
      m_pending_delta(0)
{
    SC_METHOD( fire_event );
    sensitive << m_e;
    dont_initialize();
}